

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall cmCTestRunTest::MemCheckPostProcess(cmCTestRunTest *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  if (this->TestHandler->MemCheck == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar1 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
    poVar1 = std::operator<<(poVar1,": process test output now: ");
    poVar1 = std::operator<<(poVar1,(string *)this->TestProperties);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)&this->TestResult);
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x19c,local_1b0[0],(this->TestHandler->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmCTestMemCheckHandler::PostProcessTest
              ((cmCTestMemCheckHandler *)this->TestHandler,&this->TestResult,this->Index);
  }
  return;
}

Assistant:

void cmCTestRunTest::MemCheckPostProcess()
{
  if (!this->TestHandler->MemCheck) {
    return;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index
                       << ": process test output now: "
                       << this->TestProperties->Name << " "
                       << this->TestResult.Name << std::endl,
                     this->TestHandler->GetQuiet());
  cmCTestMemCheckHandler* handler =
    static_cast<cmCTestMemCheckHandler*>(this->TestHandler);
  handler->PostProcessTest(this->TestResult, this->Index);
}